

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::ArchiveShellCommand::executeExternalCommand
          (ArchiveShellCommand *this,BuildSystem *param_1,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  Child CVar1;
  StringRef *pSVar2;
  int iVar3;
  long lVar4;
  ArrayRef<llvm::StringRef> commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Child local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  Child local_f0;
  Child CStack_e8;
  ulong local_e0;
  Child *local_d8;
  char acStack_d0 [8];
  code *local_c8;
  undefined8 uStack_c0;
  TaskInterface local_b8;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  StringRef *local_88;
  long lStack_80;
  long local_78;
  undefined1 local_68 [24];
  code *local_50;
  bool local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_b8.ctx = ti.ctx;
  local_b8.impl = ti.impl;
  llvm::Twine::Twine((Twine *)&local_100,&this->archiveName);
  iVar3 = llvm::sys::fs::remove((fs *)&local_100.character,(char *)0x1);
  if (iVar3 == 0) {
    (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_(&local_40,this);
    local_88 = (StringRef *)0x0;
    lStack_80 = 0;
    local_78 = 0;
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_88,
               local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pSVar2 = local_88;
    lVar4 = lStack_80 - (long)local_88;
    local_a8 = 1;
    uStack_a0 = 0;
    uStack_98 = 0;
    uStack_90 = 0x101;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               &local_100,&completionFn->Storage);
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    local_d8 = (Child *)0x0;
    acStack_d0[0] = '\0';
    acStack_d0[1] = '\0';
    acStack_d0[2] = '\0';
    acStack_d0[3] = '\0';
    acStack_d0[4] = '\0';
    acStack_d0[5] = '\0';
    acStack_d0[6] = '\0';
    acStack_d0[7] = '\0';
    local_d8 = (Child *)operator_new(0x28);
    local_d8[4].character = (char)local_e0;
    if ((char)local_e0 == '\x01') {
      local_d8->twine = (Twine *)0x0;
      local_d8[1].twine = (Twine *)0x0;
      local_d8[2].twine = (Twine *)0x0;
      local_d8[3] = CStack_e8;
      if (local_f0.twine != (Twine *)0x0) {
        CVar1._4_4_ = uStack_f4;
        CVar1.decUI = uStack_f8;
        *local_d8 = local_100;
        local_d8[1] = CVar1;
        local_d8[2] = local_f0;
        local_f0.twine = (Twine *)0x0;
        CStack_e8.twine = (Twine *)0x0;
      }
    }
    local_48 = true;
    local_50 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
               ::_M_invoke;
    local_68[8] = acStack_d0[0];
    local_68[9] = acStack_d0[1];
    local_68[10] = acStack_d0[2];
    local_68[0xb] = acStack_d0[3];
    local_68[0xc] = acStack_d0[4];
    local_68[0xd] = acStack_d0[5];
    local_68[0xe] = acStack_d0[6];
    local_68[0xf] = acStack_d0[7];
    local_68._16_8_ =
         std::
         _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
         ::_M_manager;
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    attributes._2_6_ = uStack_a6;
    attributes.canSafelyInterrupt = (bool)(undefined1)local_a8;
    attributes.connectToConsole = (bool)local_a8._1_1_;
    attributes._26_6_ = uStack_8e;
    attributes.inheritEnvironment = (bool)(undefined1)uStack_90;
    attributes.controlEnabled = (bool)uStack_90._1_1_;
    attributes.workingDir.Data = (char *)uStack_a0;
    attributes.workingDir.Length = uStack_98;
    commandLine.Length = lVar4 >> 4;
    commandLine.Data = pSVar2;
    local_68._0_8_ = local_d8;
    llbuild::core::TaskInterface::spawn
              (&local_b8,context,commandLine,
               (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_68,
               (ProcessDelegate *)0x0);
    if (local_48 == true) {
      if ((code *)local_68._16_8_ != (code *)0x0) {
        (*(code *)local_68._16_8_)(local_68,local_68,3);
      }
      local_48 = false;
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
    if ((char)local_e0 == '\x01') {
      if (local_f0.twine != (Twine *)0x0) {
        (*(code *)local_f0)(&local_100,&local_100,3);
      }
      local_e0 = local_e0 & 0xffffffffffffff00;
    }
    if (local_88 != (StringRef *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
  }
  else if ((completionFn->Storage).hasVal == true) {
    local_100 = (Child)0xffffffff00000001;
    uStack_f8 = 0xffffffff;
    local_f0 = (Child)0x0;
    CStack_e8 = (Child)0x0;
    local_e0 = 0;
    if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
        == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (completionFn,&local_100);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // First delete the current archive
    // TODO instead insert, update and remove files from the archive
    if (llvm::sys::fs::remove(archiveName, /*IgnoreNonExisting*/ true)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Create archive
    auto args = getArgs();
    ti.spawn(context,
             std::vector<StringRef>(args.begin(), args.end()),
             {}, {true},
             {[completionFn](ProcessResult result) {
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }});
  }